

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O0

double __thiscall
f8n::prefs::Preferences::GetDouble(Preferences *this,char *key,double defaultValue)

{
  double extraout_XMM0_Qa;
  allocator<char> local_41;
  string local_40 [32];
  double local_20;
  double defaultValue_local;
  char *key_local;
  Preferences *this_local;
  
  local_20 = defaultValue;
  defaultValue_local = (double)key;
  key_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,key,&local_41);
  (*(this->super_IPreferences)._vptr_IPreferences[0xc])(local_20,this,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return extraout_XMM0_Qa;
}

Assistant:

double Preferences::GetDouble(const char* key, double defaultValue) {
    return this->GetDouble(std::string(key), defaultValue);
}